

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O0

void vkt::texture::anon_unknown_0::getBasicTexCoord2D
               (vector<float,_std::allocator<float>_> *dst,int cellNdx)

{
  int iVar1;
  Vec2 *topRight;
  Vec2 *bottomLeft;
  int cellNdx_local;
  vector<float,_std::allocator<float>_> *dst_local;
  
  if (texture::(anonymous_namespace)::
      getBasicTexCoord2D(std::vector<float,std::allocator<float>>&,int)::s_basicCoords == '\0') {
    iVar1 = __cxa_guard_acquire(&texture::(anonymous_namespace)::
                                 getBasicTexCoord2D(std::vector<float,std::allocator<float>>&,int)::
                                 s_basicCoords);
    if (iVar1 != 0) {
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[0].bottomLeft,-0.1,0.1);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[0].topRight,0.8,1.0);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[1].bottomLeft,-0.3,-0.6);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[1].topRight,0.7,0.4);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[2].bottomLeft,-0.3,0.6);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[2].topRight,0.7,-0.9);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[3].bottomLeft,-0.8,0.6);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[3].topRight,0.7,-0.9);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[4].bottomLeft,-0.5,-0.5);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[4].topRight,1.5,1.5);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[5].bottomLeft,1.0,-1.0);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[5].topRight,-1.3,1.0);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[6].bottomLeft,1.2,-1.0);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[6].topRight,-1.3,1.6);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[7].bottomLeft,2.2,-1.1);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[7].topRight,-1.3,0.8);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[8].bottomLeft,-1.5,1.6);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[8].topRight,1.7,-1.4);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[9].bottomLeft,2.0,1.6);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[9].topRight,2.3,-1.4);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[10].bottomLeft,1.3,-2.6);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[10].topRight,-2.7,2.9);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[0xb].bottomLeft,-0.8,-6.6);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[0xb].topRight,6.0,-0.9);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[0xc].bottomLeft,-8.0,9.0);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[0xc].topRight,8.3,-7.0);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[0xd].bottomLeft,-16.0,10.0);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[0xd].topRight,18.3,24.0);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[0xe].bottomLeft,30.2,55.0);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[0xe].topRight,-24.3,-1.6);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[0xf].bottomLeft,-33.2,64.1);
      tcu::Vector<float,_2>::Vector(&getBasicTexCoord2D::s_basicCoords[0xf].topRight,32.1,-64.1);
      __cxa_guard_release(&texture::(anonymous_namespace)::
                           getBasicTexCoord2D(std::vector<float,std::allocator<float>>&,int)::
                           s_basicCoords);
    }
  }
  glu::TextureTestUtil::computeQuadTexCoord2D
            (dst,&getBasicTexCoord2D::s_basicCoords[cellNdx].bottomLeft,
             &getBasicTexCoord2D::s_basicCoords[cellNdx].topRight);
  return;
}

Assistant:

static void getBasicTexCoord2D (std::vector<float>& dst, int cellNdx)
{
	static const struct
	{
		const Vec2	bottomLeft;
		const Vec2	topRight;
	} s_basicCoords[] =
	{
		{ Vec2(-0.1f,  0.1f), Vec2( 0.8f,  1.0f) },
		{ Vec2(-0.3f, -0.6f), Vec2( 0.7f,  0.4f) },
		{ Vec2(-0.3f,  0.6f), Vec2( 0.7f, -0.9f) },
		{ Vec2(-0.8f,  0.6f), Vec2( 0.7f, -0.9f) },

		{ Vec2(-0.5f, -0.5f), Vec2( 1.5f,  1.5f) },
		{ Vec2( 1.0f, -1.0f), Vec2(-1.3f,  1.0f) },
		{ Vec2( 1.2f, -1.0f), Vec2(-1.3f,  1.6f) },
		{ Vec2( 2.2f, -1.1f), Vec2(-1.3f,  0.8f) },

		{ Vec2(-1.5f,  1.6f), Vec2( 1.7f, -1.4f) },
		{ Vec2( 2.0f,  1.6f), Vec2( 2.3f, -1.4f) },
		{ Vec2( 1.3f, -2.6f), Vec2(-2.7f,  2.9f) },
		{ Vec2(-0.8f, -6.6f), Vec2( 6.0f, -0.9f) },

		{ Vec2( -8.0f,   9.0f), Vec2(  8.3f,  -7.0f) },
		{ Vec2(-16.0f,  10.0f), Vec2( 18.3f,  24.0f) },
		{ Vec2( 30.2f,  55.0f), Vec2(-24.3f,  -1.6f) },
		{ Vec2(-33.2f,  64.1f), Vec2( 32.1f, -64.1f) },
	};

	DE_ASSERT(de::inBounds(cellNdx, 0, DE_LENGTH_OF_ARRAY(s_basicCoords)));

	const Vec2& bottomLeft	= s_basicCoords[cellNdx].bottomLeft;
	const Vec2& topRight	= s_basicCoords[cellNdx].topRight;

	computeQuadTexCoord2D(dst, bottomLeft, topRight);
}